

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler.c
# Opt level: O3

void WebPRescalerImportRowExpand_C(WebPRescaler *wrk,uint8_t *src)

{
  uint uVar1;
  rescaler_t *prVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar11;
  int iVar12;
  rescaler_t *prVar13;
  ulong uVar10;
  
  uVar1 = wrk->num_channels;
  lVar4 = (long)(int)uVar1;
  if (0 < lVar4) {
    iVar5 = wrk->dst_width * uVar1;
    prVar2 = wrk->frow;
    lVar7 = 0;
    uVar8 = uVar1;
    do {
      uVar9 = (uint)src[lVar7];
      uVar10 = lVar7 + lVar4;
      uVar6 = uVar9;
      if (1 < wrk->src_width) {
        uVar6 = (uint)src[uVar10];
      }
      iVar12 = wrk->x_add;
      prVar2[lVar7] = iVar12 * (uint)src[lVar7];
      if ((int)uVar10 < iVar5) {
        prVar13 = prVar2 + uVar8;
        uVar11 = uVar8;
        do {
          iVar12 = iVar12 - wrk->x_sub;
          uVar3 = uVar6;
          if (iVar12 < 0) {
            uVar9 = (int)uVar10 + uVar1;
            uVar10 = (ulong)uVar9;
            iVar12 = iVar12 + wrk->x_add;
            uVar3 = (uint)src[(int)uVar9];
            uVar9 = uVar6;
          }
          uVar6 = uVar3;
          *prVar13 = (uVar9 - uVar6) * iVar12 + wrk->x_add * uVar6;
          prVar13 = prVar13 + lVar4;
          uVar11 = uVar11 + uVar1;
        } while ((int)uVar11 < iVar5);
      }
      lVar7 = lVar7 + 1;
      uVar8 = uVar8 + 1;
    } while (lVar7 != lVar4);
  }
  return;
}

Assistant:

void WebPRescalerImportRowExpand_C(WebPRescaler* const wrk,
                                   const uint8_t* src) {
  const int x_stride = wrk->num_channels;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  int channel;
  assert(!WebPRescalerInputDone(wrk));
  assert(wrk->x_expand);
  for (channel = 0; channel < x_stride; ++channel) {
    int x_in = channel;
    int x_out = channel;
    // simple bilinear interpolation
    int accum = wrk->x_add;
    rescaler_t left = (rescaler_t)src[x_in];
    rescaler_t right =
        (wrk->src_width > 1) ? (rescaler_t)src[x_in + x_stride] : left;
    x_in += x_stride;
    while (1) {
      wrk->frow[x_out] = right * wrk->x_add + (left - right) * accum;
      x_out += x_stride;
      if (x_out >= x_out_max) break;
      accum -= wrk->x_sub;
      if (accum < 0) {
        left = right;
        x_in += x_stride;
        assert(x_in < wrk->src_width * x_stride);
        right = (rescaler_t)src[x_in];
        accum += wrk->x_add;
      }
    }
    assert(wrk->x_sub == 0 /* <- special case for src_width=1 */ || accum == 0);
  }
}